

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void common_embd_normalize(float *inp,float *out,int n,int embd_norm)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  if (embd_norm == 2) {
    uVar1 = 0;
    uVar2 = (ulong)(uint)n;
    if (n < 1) {
      uVar2 = uVar1;
    }
    dVar3 = 0.0;
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      dVar3 = dVar3 + (double)(inp[uVar1] * inp[uVar1]);
    }
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
  }
  else if (embd_norm == 0) {
    uVar1 = 0;
    uVar2 = (ulong)(uint)n;
    if (n < 1) {
      uVar2 = uVar1;
    }
    dVar3 = 0.0;
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      dVar4 = (double)ABS(inp[uVar1]);
      if ((double)ABS(inp[uVar1]) <= dVar3) {
        dVar4 = dVar3;
      }
      dVar3 = dVar4;
    }
    dVar3 = dVar3 / 32760.0;
  }
  else if (embd_norm == -1) {
    uVar2 = 0;
    if (0 < n) {
      uVar2 = (ulong)(uint)n;
    }
    dVar3 = 1.0;
  }
  else {
    uVar1 = 0;
    uVar2 = (ulong)(uint)n;
    if (n < 1) {
      uVar2 = uVar1;
    }
    dVar3 = 0.0;
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      dVar4 = pow((double)ABS(inp[uVar1]),(double)embd_norm);
      dVar3 = dVar3 + dVar4;
    }
    dVar3 = pow(dVar3,1.0 / (double)embd_norm);
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    out[uVar1] = inp[uVar1] * (float)(double)(-(ulong)(0.0 < dVar3) & (ulong)(1.0 / dVar3));
  }
  return;
}

Assistant:

void common_embd_normalize(const float * inp, float * out, int n, int embd_norm) {
    double sum = 0.0;

    switch (embd_norm) {
        case -1: // no normalisation
            sum = 1.0;
            break;
        case 0: // max absolute
            for (int i = 0; i < n; i++) {
                if (sum < std::abs(inp[i])) {
                    sum = std::abs(inp[i]);
                }
            }
            sum /= 32760.0; // make an int16 range
            break;
        case 2: // euclidean
            for (int i = 0; i < n; i++) {
                sum += inp[i] * inp[i];
            }
            sum = std::sqrt(sum);
            break;
        default: // p-norm (euclidean is p-norm p=2)
            for (int i = 0; i < n; i++) {
                sum += std::pow(std::abs(inp[i]), embd_norm);
            }
            sum = std::pow(sum, 1.0 / embd_norm);
            break;
    }

    const float norm = sum > 0.0 ? 1.0 / sum : 0.0f;

    for (int i = 0; i < n; i++) {
        out[i] = inp[i] * norm;
    }
}